

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_sys_cfg_st.cpp
# Opt level: O1

MPP_RET mpp_sys_cfg_st_get_h_stride(MppSysCfgStHStrd *h_stride_cfg)

{
  MPP_RET MVar1;
  MppSysCfg in_RAX;
  char *pcVar2;
  MppSysCfg cfg;
  MppSysCfg local_18;
  
  local_18 = in_RAX;
  MVar1 = mpp_sys_cfg_get(&local_18);
  if (MVar1 == MPP_OK) {
    mpp_sys_cfg_set_u32(local_18,"dec_buf_chk:enable",1);
    mpp_sys_cfg_set_u32(local_18,"dec_buf_chk:type",h_stride_cfg->type);
    mpp_sys_cfg_set_u32(local_18,"dec_buf_chk:fmt_fbc",h_stride_cfg->fmt_fbc);
    mpp_sys_cfg_set_u32(local_18,"dec_buf_chk:width",h_stride_cfg->width);
    mpp_sys_cfg_set_u32(local_18,"dec_buf_chk:h_stride_by_byte",h_stride_cfg->h_stride_by_byte);
    mpp_sys_cfg_ioctl(local_18);
    mpp_sys_cfg_get_u32(local_18,"dec_buf_chk:h_stride_by_pixel",&h_stride_cfg->h_stride_by_pixel);
    MVar1 = mpp_sys_cfg_put(local_18);
    if (MVar1 == MPP_OK) {
      MVar1 = MPP_OK;
      goto LAB_0015525b;
    }
    pcVar2 = "mpp_sys_cfg_put failed\n";
  }
  else {
    pcVar2 = "mpp_sys_cfg_get failed\n";
  }
  _mpp_log_l(2,"mpp_sys_cfg_st",pcVar2,(char *)0x0);
LAB_0015525b:
  pcVar2 = "failed";
  if (MVar1 == MPP_OK) {
    pcVar2 = "success";
  }
  _mpp_log_l(2,"mpp_sys_cfg_st","sys cfg get paras %s\n","mpp_sys_cfg_st_get_h_stride",pcVar2);
  return MVar1;
}

Assistant:

MPP_RET mpp_sys_cfg_st_get_h_stride(MppSysCfgStHStrd *h_stride_cfg)
{
    MPP_RET ret = MPP_OK;
    MppSysCfg cfg;

    ret = mpp_sys_cfg_get(&cfg);
    if (ret) {
        mpp_err("mpp_sys_cfg_get failed\n");
        goto DONE;
    }

    /* set correct parameter */
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:enable", 1);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:type", h_stride_cfg->type);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:fmt_fbc", h_stride_cfg->fmt_fbc);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:width", h_stride_cfg->width);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:h_stride_by_byte", h_stride_cfg->h_stride_by_byte);

    /* get result */
    mpp_sys_cfg_ioctl(cfg);

    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:h_stride_by_pixel",
                              &h_stride_cfg->h_stride_by_pixel);

    ret = mpp_sys_cfg_put(cfg);
    if (ret) {
        mpp_err("mpp_sys_cfg_put failed\n");
        goto DONE;
    }

DONE:
    mpp_err_f("sys cfg get paras %s\n", ret ? "failed" : "success");
    return ret;
}